

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

uint64_t getnumattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  char *__s;
  char *pcVar1;
  char *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint64_t res;
  char *cc;
  char *c;
  ulonglong local_38;
  xmlAttr *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  __s = getattrib((rnndb *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,
                  (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),in_stack_ffffffffffffffd0);
  pcVar1 = strchr(__s,0x78);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(__s,0x58);
    if (pcVar1 == (char *)0x0) {
      local_38 = strtoull(__s,(char **)&stack0xffffffffffffffd0,10);
      goto LAB_00107900;
    }
  }
  local_38 = strtoull(__s,(char **)&stack0xffffffffffffffd0,0x10);
LAB_00107900:
  if (*(char *)&in_stack_ffffffffffffffd0->_private != '\0') {
    fprintf(_stderr,"%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n",in_RSI,(ulong)in_EDX
            ,__s,*(undefined8 *)(in_RCX + 0x10));
    *(undefined4 *)(in_RDI + 0x80) = 1;
  }
  return local_38;
}

Assistant:

static uint64_t getnumattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	char *cc;
	uint64_t res;
	if (strchr(c, 'x') || strchr(c, 'X'))
		res = strtoull(c, &cc, 16);
	else
		res = strtoull(c, &cc, 10);
	if (*cc)  {
		fprintf (stderr, "%s:%d: invalid numeric value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
		db->estatus = 1;
	}
	return res;
}